

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceMatrixDecomposition::ForceMatrixDecomposition
          (ForceMatrixDecomposition *this,SimInfo *info,InteractionManager *iMan)

{
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *this_00;
  pointer pVVar1;
  Vector3<int> local_38;
  
  ForceDecomposition::ForceDecomposition(&this->super_ForceDecomposition,info,iMan);
  (this->super_ForceDecomposition)._vptr_ForceDecomposition =
       (_func_int **)&PTR__ForceMatrixDecomposition_0033d598;
  this_00 = &(this->super_ForceDecomposition).cellOffsets_;
  (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->groupCutoff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groupCutoff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groupCutoff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->groupToGtype).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->groupToGtype).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->groupToGtype).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  pVVar1 = (this->super_ForceDecomposition).cellOffsets_.
           super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_ForceDecomposition).cellOffsets_.
      super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->super_ForceDecomposition).cellOffsets_.
    super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  local_38.super_Vector<int,_3U>.data_[2] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[2] = 0;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = -1;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = 0;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = -1;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 0;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  local_38.super_Vector<int,_3U>.data_[0] = 1;
  local_38.super_Vector<int,_3U>.data_[1] = 1;
  local_38.super_Vector<int,_3U>.data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,&local_38)
  ;
  return;
}

Assistant:

ForceMatrixDecomposition::ForceMatrixDecomposition(SimInfo* info,
                                                     InteractionManager* iMan) :
      ForceDecomposition(info, iMan) {
    // Row and colum scans must visit all surrounding cells
    cellOffsets_.clear();
    cellOffsets_.push_back(Vector3i(-1, -1, -1));
    cellOffsets_.push_back(Vector3i(0, -1, -1));
    cellOffsets_.push_back(Vector3i(1, -1, -1));
    cellOffsets_.push_back(Vector3i(-1, 0, -1));
    cellOffsets_.push_back(Vector3i(0, 0, -1));
    cellOffsets_.push_back(Vector3i(1, 0, -1));
    cellOffsets_.push_back(Vector3i(-1, 1, -1));
    cellOffsets_.push_back(Vector3i(0, 1, -1));
    cellOffsets_.push_back(Vector3i(1, 1, -1));
    cellOffsets_.push_back(Vector3i(-1, -1, 0));
    cellOffsets_.push_back(Vector3i(0, -1, 0));
    cellOffsets_.push_back(Vector3i(1, -1, 0));
    cellOffsets_.push_back(Vector3i(-1, 0, 0));
    cellOffsets_.push_back(Vector3i(0, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 0, 0));
    cellOffsets_.push_back(Vector3i(-1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 1, 0));
    cellOffsets_.push_back(Vector3i(1, 1, 0));
    cellOffsets_.push_back(Vector3i(-1, -1, 1));
    cellOffsets_.push_back(Vector3i(0, -1, 1));
    cellOffsets_.push_back(Vector3i(1, -1, 1));
    cellOffsets_.push_back(Vector3i(-1, 0, 1));
    cellOffsets_.push_back(Vector3i(0, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 0, 1));
    cellOffsets_.push_back(Vector3i(-1, 1, 1));
    cellOffsets_.push_back(Vector3i(0, 1, 1));
    cellOffsets_.push_back(Vector3i(1, 1, 1));
  }